

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
::try_emplace_impl<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,
          pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *k)

{
  tuple<> local_21;
  tuple<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&>
  local_20;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
  ::find_or_prepare_insert<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
              *)this,k);
  if (__return_storage_ptr__->second == true) {
    local_20.
    super__Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&>
    .
    super__Head_base<0UL,_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&>
          )(_Tuple_impl<0UL,_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&>
            )k;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<std::pair<google::protobuf::Message_const*,std::__cxx11::string>&&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
                *)this,__return_storage_ptr__->first,
               (piecewise_construct_t *)&std::piecewise_construct,&local_20,&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }